

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# header.c
# Opt level: O1

prf_node_t * prf_header_clone_f(prf_node_t *orig,prf_model_t *source,prf_model_t *target)

{
  byte *pbVar1;
  pool_t pool_id;
  uint16_t uVar2;
  prf_node_t *node;
  uint8_t *__dest;
  
  if (target->mempool_id == 0) {
    node = prf_node_create();
  }
  else {
    node = (prf_node_t *)pool_malloc(target->mempool_id,0x28);
    prf_node_clear(node);
  }
  if (node == (prf_node_t *)0x0) {
    node = (prf_node_t *)0x0;
    prf_error(9,"memory allocation failure (returned NULL)");
  }
  else {
    pool_id = target->mempool_id;
    if (pool_id == 0) {
      pbVar1 = (byte *)((long)&node->flags + 1);
      *pbVar1 = *pbVar1 | 1;
    }
    uVar2 = orig->length;
    node->opcode = orig->opcode;
    node->length = uVar2;
    if (pool_id == 0) {
      __dest = (uint8_t *)malloc((ulong)orig->length + 2);
    }
    else {
      __dest = (uint8_t *)pool_malloc(pool_id,orig->length + 2);
    }
    node->data = __dest;
    if (__dest == (uint8_t *)0x0) {
      prf_error(9,"memory allocation failure (returned NULL)");
      prf_node_destroy(node);
      node = (prf_node_t *)0x0;
    }
    else {
      memcpy(__dest,orig->data,(ulong)orig->length + 2);
    }
  }
  return node;
}

Assistant:

static
prf_node_t *
prf_header_clone_f(
    prf_node_t * orig,
    prf_model_t * source,
    prf_model_t * target )
{
    prf_node_t * clone;

    assert( orig != NULL && source != NULL && target != NULL );

    if ( target->mempool_id == 0 ) {
        clone = prf_node_create();
    } else {
        clone = (prf_node_t *)pool_malloc( target->mempool_id, 
					   sizeof( prf_node_t ) );
        prf_node_clear( clone );
    }
    if ( clone == NULL ) {
        prf_error( 9, "memory allocation failure (returned NULL)" );
        return NULL;
    }
    if ( target->mempool_id == 0 )
        clone->flags |= PRF_NODE_MEMPOOLED;

    clone->opcode = orig->opcode;
    clone->length = orig->length;
    assert( orig->data != NULL && orig->length > 4 );

    if ( target->mempool_id == 0 )
        clone->data = (uint8_t *)malloc( orig->length - 4 + NODE_DATA_PAD );
    else
        clone->data = (uint8_t *)pool_malloc( target->mempool_id,
            orig->length - 4 + NODE_DATA_PAD );
    if ( clone->data == NULL ) {
        prf_error( 9, "memory allocation failure (returned NULL)" );
        prf_node_destroy( clone );
        return NULL;
    }
    memcpy( clone->data, orig->data, orig->length - 4 + NODE_DATA_PAD );
 /* clone->flags */
    return clone;
}